

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontMatrix.cpp
# Opt level: O3

int __thiscall
TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>::
Subst_Backward(TPZFrontMatrix<long_double,_TPZFileEqnStorage<long_double>,_TPZFrontNonSym<long_double>_>
               *this,TPZFMatrix<long_double> *b)

{
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Entering Backward Substitution\n",0x1f);
  std::ostream::flush();
  TPZFileEqnStorage<long_double>::Backward
            (&this->fStorage,b,(this->fFront).super_TPZFront<long_double>.fDecomposeType);
  return 1;
}

Assistant:

int TPZFrontMatrix<TVar,store, front>::Subst_Backward(TPZFMatrix<TVar> *b) const {
	cout << "Entering Backward Substitution\n";
	cout.flush();
	DecomposeType dec = fFront.GetDecomposeType();
//	if(dec != ECholesky) cout << "TPZFrontMatrix::Subst_Forward non matching decomposition\n";
	fStorage.Backward(*b, dec);
	return 1;
}